

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_file_system.cpp
# Opt level: O3

void __thiscall
duckdb::ZStdFile::ZStdFile
          (ZStdFile *this,
          unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
          *child_handle_p,string *path,bool write)

{
  pointer *__ptr;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_28;
  
  (this->super_CompressedFile).super_FileHandle._vptr_FileHandle =
       (_func_int **)&PTR__ZStdFile_019a6980;
  local_28._M_head_impl =
       (child_handle_p->
       super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)._M_t.
       super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (child_handle_p->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>).
  _M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  CompressedFile::CompressedFile
            (&this->super_CompressedFile,&(this->zstd_fs).super_CompressedFileSystem,
             (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
             &local_28,path);
  if (local_28._M_head_impl != (FileHandle *)0x0) {
    (*(local_28._M_head_impl)->_vptr_FileHandle[1])();
  }
  local_28._M_head_impl = (FileHandle *)0x0;
  (this->super_CompressedFile).super_FileHandle._vptr_FileHandle =
       (_func_int **)&PTR__ZStdFile_019a6980;
  (this->zstd_fs).super_CompressedFileSystem.super_FileSystem._vptr_FileSystem =
       (_func_int **)&PTR__FileSystem_019a67e8;
  CompressedFile::Initialize(&this->super_CompressedFile,write);
  return;
}

Assistant:

ZStdFile(unique_ptr<FileHandle> child_handle_p, const string &path, bool write)
	    : CompressedFile(zstd_fs, std::move(child_handle_p), path) {
		Initialize(write);
	}